

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O3

void __thiscall mocker::SSADestruction::sequentializeParallelCopies(SSADestruction *this)

{
  BasicBlock *this_00;
  _Sp_alloc_shared_tag<std::allocator<mocker::ir::Load>_> __a;
  FunctionModule *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _List_node_base *p_Var2;
  mapped_type *pmVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  iterator iVar5;
  Reg *__tmp;
  element_type *peVar6;
  _List_node_base *p_Var7;
  shared_ptr<mocker::ir::Addr> newVal;
  shared_ptr<mocker::ir::Reg> p;
  mapped_type addr;
  shared_ptr<mocker::ir::Reg> oldVal;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
  regHoldingOldValue;
  undefined1 local_118 [48];
  pointer local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  shared_ptr<mocker::ir::Reg> local_b8;
  shared_ptr<mocker::ir::IRInst> local_a8;
  shared_ptr<mocker::ir::IRInst> local_98;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  _List_node_base *local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  pFVar1 = (this->super_FuncPass).func;
  local_d8.field_2._M_allocated_capacity =
       (size_type)
       (pFVar1->bbs).
       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  local_78 = (_List_node_base *)&pFVar1->bbs;
  if ((_List_node_base *)local_d8.field_2._M_allocated_capacity != local_78) {
    local_80 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->parallelCopies;
    local_70 = &(this->addresses)._M_h;
    __a._M_a = (allocator<mocker::ir::Load> *)(local_118 + 0x20);
    local_d8.field_2._8_8_ = this;
    do {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_e8 = (pointer)((_List_node_base *)(local_d8.field_2._M_allocated_capacity + 0x10))->
                          _M_next;
      p_Var2 = (_List_node_base *)
               std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_80,(key_type *)&local_e8);
      p_Var7 = p_Var2->_M_next;
      if (p_Var7 != p_Var2) {
        this_00 = (BasicBlock *)(local_d8.field_2._M_allocated_capacity + 0x10);
        do {
          pFVar1 = *(FunctionModule **)(local_d8.field_2._8_8_ + 8);
          local_e8 = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_118,&pFVar1->identifier);
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_68,(key_type *)&(p_Var7[1]._M_next)->_M_prev);
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
          peVar6 = (element_type *)local_118._0_8_;
          local_118._0_8_ = (pointer)0x0;
          local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pmVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar6;
          this_01 = (pmVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          (pmVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi = p_Var4;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            peVar6 = (pmVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            p_Var4 = (pmVar3->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
          }
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_b8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
          local_b8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = p_Var4;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,(ulong)(local_d8._M_dataplus._M_p + 1));
          }
          iVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_70,(key_type *)&(p_Var7[1]._M_next)->_M_prev);
          if (iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          local_e8 = *(pointer *)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                             ._M_cur + 0x28);
          local_e0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)iVar5.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                             ._M_cur + 0x30);
          if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_e0->_M_use_count = local_e0->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_e0->_M_use_count = local_e0->_M_use_count + 1;
            }
          }
          local_118._0_8_ = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                     (Load **)local_118,__a,&local_b8,(shared_ptr<mocker::ir::Reg> *)&local_e8);
          local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_118._0_8_;
          local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
          local_118._0_8_ = (pointer)0x0;
          local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ir::BasicBlock::appendInstBeforeTerminator(this_00,&local_98);
          if (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          local_118._0_8_ = p_Var7[2]._M_next;
          local_118._8_8_ = p_Var7[2]._M_prev;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_)->_M_use_count +
                   1;
            }
          }
          ir::dycLocalReg((ir *)__a._M_a,(shared_ptr<mocker::ir::Addr> *)(p_Var7 + 2));
          if ((pointer)local_118._32_8_ != (pointer)0x0) {
            iVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&local_68,(key_type *)(local_118._32_8_ + 8));
            if (iVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_118._0_8_ =
                   *(undefined8 *)
                    ((long)iVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                           ._M_cur + 0x28);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)iVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_true>
                                ._M_cur + 0x30));
            }
          }
          if ((pointer)local_118._40_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_);
          }
          local_118._32_8_ = (pointer)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x28),
                     (Store **)__a._M_a,(allocator<mocker::ir::Store> *)(local_118 + 0x1f),
                     (shared_ptr<mocker::ir::Reg> *)&local_e8,
                     (shared_ptr<mocker::ir::Addr> *)local_118);
          local_a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_118._32_8_;
          local_a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_;
          local_118._32_8_ = (pointer)0x0;
          local_118._40_8_ = (pointer)0x0;
          ir::BasicBlock::appendInstBeforeTerminator(this_00,&local_a8);
          if ((pointer)local_a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((pointer)local_118._40_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._40_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
          }
          if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
          }
          if (local_b8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          p_Var7 = (((_List_base<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>
                      *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        } while (p_Var7 != p_Var2);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      local_d8.field_2._M_allocated_capacity = *local_d8.field_2._M_allocated_capacity;
    } while ((_List_node_base *)local_d8.field_2._M_allocated_capacity != local_78);
  }
  return;
}

Assistant:

void SSADestruction::sequentializeParallelCopies() {
  // We adopt a naive approach here: we first load the old values to temporary
  // registers and rename the later use. Then, for each Copy, we simply put a
  // Store.
  // Redundant Loads can be eliminate in later passes.

  for (auto &bb : func.getMutableBBs()) {
    std::unordered_map<std::string, std::shared_ptr<ir::Reg>>
        regHoldingOldValue;
    const auto &pcopies = parallelCopies[bb.getLabelID()];
    for (auto &pcopy : pcopies) {
      auto oldVal = regHoldingOldValue[pcopy.dest->getIdentifier()] =
          func.makeTempLocalReg();
      auto addr = addresses.at(pcopy.dest->getIdentifier());
      bb.appendInstBeforeTerminator(std::make_shared<ir::Load>(oldVal, addr));
      std::shared_ptr<ir::Addr> newVal = pcopy.val;
      if (auto p = ir::dycLocalReg(pcopy.val)) {
        auto iter = regHoldingOldValue.find(p->getIdentifier());
        if (iter != regHoldingOldValue.end())
          newVal = iter->second;
      }
      bb.appendInstBeforeTerminator(std::make_shared<ir::Store>(addr, newVal));
    }
  }
}